

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetSourceFilePropertyCommand.cxx
# Opt level: O3

bool __thiscall
cmGetSourceFilePropertyCommand::InitialPass
          (cmGetSourceFilePropertyCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  string *name;
  pointer pbVar1;
  int iVar2;
  cmSourceFile *this_00;
  char *value;
  long lVar3;
  cmMakefile *pcVar4;
  string local_50;
  
  name = (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)name;
  if (lVar3 == 0x60) {
    this_00 = cmMakefile::GetSource((this->super_cmCommand).Makefile,name + 1);
    if ((this_00 == (cmSourceFile *)0x0) &&
       ((iVar2 = std::__cxx11::string::compare
                           ((char *)((args->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start + 2)), iVar2 != 0 ||
        (this_00 = cmMakefile::CreateSource((this->super_cmCommand).Makefile,name + 1,false),
        this_00 == (cmSourceFile *)0x0)))) {
LAB_002c11eb:
      pcVar4 = (this->super_cmCommand).Makefile;
      value = "NOTFOUND";
    }
    else {
      iVar2 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + 2));
      if (iVar2 == 0) {
        pcVar4 = (this->super_cmCommand).Makefile;
        cmSourceFile::GetLanguage_abi_cxx11_(&local_50,this_00);
        cmMakefile::AddDefinition(pcVar4,name,local_50._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_002c123d;
        goto LAB_002c1230;
      }
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((pbVar1[2]._M_string_length == 0) ||
         (value = cmSourceFile::GetPropertyForUser(this_00,pbVar1 + 2), value == (char *)0x0))
      goto LAB_002c11eb;
      pcVar4 = (this->super_cmCommand).Makefile;
    }
    cmMakefile::AddDefinition(pcVar4,name,value);
  }
  else {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_002c123d;
LAB_002c1230:
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
LAB_002c123d:
  return lVar3 == 0x60;
}

Assistant:

bool cmGetSourceFilePropertyCommand::InitialPass(
  std::vector<std::string> const& args, cmExecutionStatus&)
{
  if (args.size() != 3) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }
  std::string const& var = args[0];
  std::string const& file = args[1];
  cmSourceFile* sf = this->Makefile->GetSource(file);

  // for the location we must create a source file first
  if (!sf && args[2] == "LOCATION") {
    sf = this->Makefile->CreateSource(file);
  }
  if (sf) {
    if (args[2] == "LANGUAGE") {
      this->Makefile->AddDefinition(var, sf->GetLanguage().c_str());
      return true;
    }
    const char* prop = CM_NULLPTR;
    if (!args[2].empty()) {
      prop = sf->GetPropertyForUser(args[2]);
    }
    if (prop) {
      this->Makefile->AddDefinition(var, prop);
      return true;
    }
  }

  this->Makefile->AddDefinition(var, "NOTFOUND");
  return true;
}